

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase903::run(TestCase903 *this)

{
  PromiseBase node;
  char *pcVar1;
  size_t sVar2;
  long *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __pid_t _Var6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char buf [4];
  PipeThread pipeThread;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  AsyncIoContext ioContext;
  char local_134 [4];
  PromiseBase local_130;
  String local_128;
  uint local_10c;
  undefined8 *local_108;
  long *local_100;
  undefined8 *local_f8;
  long local_f0;
  undefined8 *local_e8;
  long *local_e0;
  undefined1 local_d8 [48];
  bool local_a8;
  undefined8 *local_a0;
  long *local_98;
  undefined8 *local_90;
  long *local_88;
  void *local_80;
  char *local_70;
  char *pcStack_68;
  undefined8 local_60;
  char *local_58;
  char *pcStack_50;
  undefined8 local_48;
  char *local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  setupAsyncIo();
  plVar3 = local_88;
  local_100 = (long *)operator_new(0x10);
  *local_100 = (long)&PTR_operator___006331d8;
  local_108 = &kj::_::
               HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<kj::(anonymous_namespace)::TestCase903::run()::$_0>>
               ::instance;
  (**(code **)(*plVar3 + 0x20))(&local_f8,plVar3);
  plVar3 = local_100;
  if (local_100 != (long *)0x0) {
    local_100 = (long *)0x0;
    (**(code **)*local_108)(local_108,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  local_134[0] = '\0';
  local_134[1] = '\0';
  local_134[2] = '\0';
  local_134[3] = '\0';
  (**(code **)local_e0[1])(local_d8,local_e0 + 1,&kj::_::ByteLiteral<4ul>,3);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_38 = "run";
  local_30 = 0x300000396;
  Promise<void>::wait((Promise<void> *)local_d8,local_80);
  uVar4 = local_d8._0_8_;
  if ((PromiseArenaMember *)local_d8._0_8_ != (PromiseArenaMember *)0x0) {
    local_d8._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
  }
  (**(code **)(*local_e0 + 8))(&local_128,local_e0,local_134,3,4);
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_50 = "run";
  local_48 = 0x4e00000397;
  _Var6 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_128,local_80);
  pcVar1 = local_128.content.ptr;
  local_d8._8_8_ = CONCAT44(extraout_var,_Var6);
  local_d8[0x20] = (char *)local_d8._8_8_ == (char *)0x3;
  local_d8._0_4_ = 3;
  local_d8._16_8_ = " == ";
  local_d8._24_8_ = &DAT_00000005;
  if ((PromiseArenaMember *)local_128.content.ptr != (PromiseArenaMember *)0x0) {
    local_128.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar1);
  }
  if ((local_d8[0x20] == false) && (kj::_::Debug::minSeverity < 3)) {
    local_10c = 3;
    (**(code **)(*local_e0 + 8))(&local_130,local_e0,local_134,3,4);
    local_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcStack_68 = "run";
    local_60 = 0x4e00000397;
    _Var6 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_130,local_80);
    local_128.content.ptr = (char *)CONCAT44(extraout_var_00,_Var6);
    kj::_::Debug::
    log<char_const(&)[89],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x397,ERROR,
               "\"failed: expected \" \"(3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))\", _kjCondition, 3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope)"
               ,(char (*) [89])
                "failed: expected (3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))"
               ,(DebugComparison<unsigned_int,_unsigned_long> *)local_d8,&local_10c,
               (unsigned_long *)&local_128);
    node.node.ptr = local_130.node.ptr;
    if (local_130.node.ptr != (PromiseNode *)0x0) {
      local_130.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
    }
  }
  local_130.node.ptr = (OwnPromiseNode)(PromiseNode *)0x4f8544;
  heapString(&local_128,local_134,3);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_d8,
             (DebugExpression<char_const(&)[4]> *)&local_130,&local_128);
  sVar2 = local_128.content.size_;
  pcVar1 = local_128.content.ptr;
  if ((PromiseArenaMember *)local_128.content.ptr != (PromiseArenaMember *)0x0) {
    local_128.content.ptr = (char *)0x0;
    local_128.content.size_ = 0;
    (**(local_128.content.disposer)->_vptr_ArrayDisposer)
              (local_128.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_a8 == false) && (kj::_::Debug::minSeverity < 3)) {
    heapString(&local_128,local_134,3);
    kj::_::Debug::
    log<char_const(&)[49],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x398,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (heapString(buf, 3))\", _kjCondition, \"foo\", heapString(buf, 3)"
               ,(char (*) [49])"failed: expected (\"foo\") == (heapString(buf, 3))",
               (DebugComparison<const_char_(&)[4],_kj::String> *)local_d8,(char (*) [4])0x4f8544,
               &local_128);
    sVar2 = local_128.content.size_;
    pcVar1 = local_128.content.ptr;
    if ((PromiseArenaMember *)local_128.content.ptr != (PromiseArenaMember *)0x0) {
      local_128.content.ptr = (char *)0x0;
      local_128.content.size_ = 0;
      (**(local_128.content.disposer)->_vptr_ArrayDisposer)
                (local_128.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  uVar5 = local_d8._16_8_;
  uVar4 = local_d8._8_8_;
  if ((char *)local_d8._8_8_ != (char *)0x0) {
    local_d8._8_8_ = (char *)0x0;
    local_d8._16_8_ = (char *)0x0;
    (***(_func_int ***)local_d8._24_8_)(local_d8._24_8_,uVar4,1,uVar5,uVar5,0);
  }
  plVar3 = local_e0;
  if (local_e0 != (long *)0x0) {
    local_e0 = (long *)0x0;
    (**(code **)*local_e8)(local_e8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if (local_f0 != 0) {
    local_f0 = 0;
    (**(code **)*local_f8)();
  }
  plVar3 = local_88;
  if (local_88 != (long *)0x0) {
    local_88 = (long *)0x0;
    (**(code **)*local_90)(local_90,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_98;
  if (local_98 != (long *)0x0) {
    local_98 = (long *)0x0;
    (**(code **)*local_a0)(local_a0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, PipeThread) {
  auto ioContext = setupAsyncIo();

  auto pipeThread = ioContext.provider->newPipeThread(
      [](AsyncIoProvider& ioProvider, AsyncIoStream& stream, WaitScope& waitScope) {
    char buf[4]{};
    stream.write("foo"_kjb).wait(waitScope);
    EXPECT_EQ(3u, stream.tryRead(buf, 3, 4).wait(waitScope));
    EXPECT_EQ("bar", heapString(buf, 3));

    // Expect disconnect.
    EXPECT_EQ(0, stream.tryRead(buf, 1, 1).wait(waitScope));
  });

  char buf[4]{};
  pipeThread.pipe->write("bar"_kjb).wait(ioContext.waitScope);
  EXPECT_EQ(3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope));
  EXPECT_EQ("foo", heapString(buf, 3));
}